

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O3

ktx_error_code_e __thiscall ktx::CommandInfo::printInfoText(CommandInfo *this,istream *file)

{
  size_type sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ktx_error_code_e kVar5;
  size_type __rlen;
  char *pcVar6;
  ktx_error_code_e kVar7;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  __string_type validationMessages;
  ostringstream messagesOS;
  undefined1 local_208 [32];
  bool local_1e8;
  undefined **local_1d8;
  basic_streambuf<char,_std::char_traits<char>_> *pbStack_1d0;
  undefined *local_1c8 [2];
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar6 = (this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
  sVar1 = (this->options).super_OptionsSingleIn.inputFilepath._M_string_length;
  if ((sVar1 == 1) && (*pcVar6 == '-')) {
    local_208._0_8_ = local_208 + 0x10;
    local_208._16_4_ = 0x69647473;
    local_208._20_2_ = 0x6e;
    local_208._8_8_ = (basic_streambuf<char,_std::char_traits<char>_> *)0x5;
  }
  else {
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar6,pcVar6 + sVar1);
  }
  local_1b8._8_8_ = 0;
  local_1a0 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:136:106)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:136:106)>
              ::_M_manager;
  local_1b8._M_unused._0_8_ = (undefined8)local_198;
  iVar4 = validateIOStream(file,(string *)local_208,false,false,
                           (function<void_(const_ktx::ValidationReport_&)> *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,
                    CONCAT26(local_208._22_2_,CONCAT24(local_208._20_2_,local_208._16_4_)) + 1);
  }
  pcVar6 = "failed";
  if (iVar4 == 0) {
    pcVar6 = "successful";
  }
  args.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_208;
  args.desc_ = 0xc;
  fmt.size_ = 0xe;
  fmt.data_ = "Validation {}\n";
  local_208._0_8_ = pcVar6;
  ::fmt::v10::vprint(fmt,args);
  std::__cxx11::stringbuf::str();
  if (pbStack_1d0 != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_208;
    fmt_00.size_ = 1;
    fmt_00.data_ = "\n";
    ::fmt::v10::vprint(fmt_00,(format_args)(auVar2 << 0x40));
    local_208._0_8_ = local_1d8;
    local_208._8_8_ = pbStack_1d0;
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_208;
    args_00.desc_ = 0xd;
    fmt_01.size_ = 2;
    fmt_01.data_ = "{}";
    ::fmt::v10::vprint(fmt_01,args_00);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_208;
  fmt_02.size_ = 1;
  fmt_02.data_ = "\n";
  ::fmt::v10::vprint(fmt_02,(format_args)(auVar3 << 0x40));
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  std::istream::seekg(file,0,0);
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) == 0) {
    local_208._8_8_ = *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
    local_208._0_8_ = &PTR__StreambufStream_0025c738;
    local_208._16_4_ = 0xc;
    local_208._24_8_ = operator_new(0x68);
    *(undefined8 *)(local_208._24_8_ + 0x50) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x58) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x40) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x48) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x30) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x38) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x60) = 0;
    local_1e8 = false;
    *(undefined4 *)(local_208._24_8_ + 0x38) = 3;
    *(undefined1 **)(local_208._24_8_ + 0x40) = local_208;
    *(undefined8 *)(local_208._24_8_ + 0x48) = 0;
    *(undefined8 *)(local_208._24_8_ + 0x50) = 0;
    *(code **)local_208._24_8_ =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::read;
    *(code **)(local_208._24_8_ + 8) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::skip;
    *(code **)(local_208._24_8_ + 0x10) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write;
    *(code **)(local_208._24_8_ + 0x18) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos;
    *(code **)(local_208._24_8_ + 0x20) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::setpos;
    *(code **)(local_208._24_8_ + 0x28) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize;
    *(code **)(local_208._24_8_ + 0x30) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::destruct;
    kVar5 = ktxPrintKTX2InfoTextForStream(local_208._24_8_);
    kVar7 = KTX_SUCCESS;
    if (iVar4 == 0) {
      kVar7 = kVar5;
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)local_208);
  }
  else {
    kVar7 = KTX_FILE_SEEK_ERROR;
    if (iVar4 != 0) {
      kVar7 = KTX_SUCCESS;
    }
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,(ulong)(local_1c8[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return kVar7;
}

Assistant:

KTX_error_code CommandInfo::printInfoText(std::istream& file) {
    std::ostringstream messagesOS;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(messagesOS, "    {}\n", issue.details);
    });

    fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
    const auto validationMessages = std::move(messagesOS).str();
    if (!validationMessages.empty()) {
        fmt::print("\n");
        fmt::print("{}", validationMessages);
    }
    fmt::print("\n");

    file.clear(); // Clear any unexpected EOF from validation
    file.seekg(0);
    if (!file)
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoTextForStream(ktx2Stream.stream());

    return validationResult == 0 ? result : KTX_SUCCESS;
}